

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Function * __thiscall
despot::Parser::CreateRewardFunction
          (Function *__return_storage_ptr__,Parser *this,TiXmlElement *e_Func)

{
  _func_int **pp_Var1;
  pointer pdVar2;
  bool bVar3;
  int t;
  TiXmlNode *base;
  mapped_type *ppVVar4;
  TiXmlElement *pTVar5;
  ulong uVar6;
  int i;
  long lVar7;
  Parser *this_00;
  Parser *this_01;
  long lVar8;
  pointer pbVar9;
  Function *func;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  string str;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  string name;
  TiXmlElement *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  Parser *local_208;
  NamedVar *local_200;
  string local_1f8;
  _Vector_base<double,_std::allocator<double>_> local_1d8;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_148;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetFirstChildText_abi_cxx11_(&local_130,this,e_Func,"Var");
  std::__cxx11::string::string((string *)&local_f0,(string *)&local_130);
  bVar3 = Variable::IsVariableName(&local_f0,&this->reward_vars_);
  std::operator+(&local_228,"In <RewardFunction>: Variable ",&local_130);
  std::operator+(&local_110,&local_228,
                 " has not been declared as a RewardVar vname within <Variable> tag.");
  base = util::tinyxml::TiXmlNode::FirstChild(&e_Func->super_TiXmlNode,"Var");
  Ensure(this,bVar3,&local_110,&base->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_f0);
  ppVVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,&local_130);
  local_200 = (NamedVar *)*ppVVar4;
  local_1b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetFirstChildText_abi_cxx11_(&local_228,this,e_Func,"Parent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8," ",(allocator<char> *)&local_198);
  local_208 = this;
  Tokenize(&local_178,&local_228,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_228);
  lVar7 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_178.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_178.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    std::__cxx11::string::string
              ((string *)&local_228,
               (string *)
               ((long)&((Variable *)
                       &(local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->_vptr_Variable +
               lVar7));
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,&local_228);
    local_1f8._M_dataplus._M_p = (pointer)*ppVVar4;
    std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
    emplace_back<despot::NamedVar*>
              ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_1b8,
               (NamedVar **)&local_1f8);
    std::__cxx11::string::~string((string *)&local_228);
    lVar7 = lVar7 + 0x20;
  }
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_148,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1b8);
  Function::Function(__return_storage_ptr__,local_200,
                     (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_148);
  this_01 = local_208;
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_148);
  pTVar5 = GetParameterElement(this_01,e_Func);
  local_250 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"Entry");
  while( true ) {
    if (local_250 == (TiXmlElement *)0x0) break;
    GetFirstChildText_abi_cxx11_((string *)&local_228,this_01,local_250,"Instance");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8," ",(allocator<char> *)&local_198);
    Tokenize(&local_160,(string *)&local_228,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"rew",(allocator<char> *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_160,
               &local_228);
    std::__cxx11::string::~string((string *)&local_228);
    local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (Parser *)&local_228;
    GetFirstChildText_abi_cxx11_((string *)&local_228,this_01,local_250,"ValueTable");
    t = ComputeNumOfEntries(this_00,&local_160,
                            (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                            &local_1b8,local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8," ",(allocator<char> *)&local_198);
    Tokenize(&local_240,(string *)&local_228,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    lVar7 = (long)local_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    to_string<int>(&local_b0,t);
    std::operator+(&local_50,"In <RewardFunction>: ",&local_b0);
    std::operator+(&local_198,&local_50," entries expected but ");
    to_string<unsigned_long>
              (&local_d0,
               (long)local_240.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_240.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+(&local_1f8,&local_198,&local_d0);
    std::operator+(&local_90,&local_1f8," found.");
    pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&local_250->super_TiXmlNode,"ValueTable");
    Ensure(this_01,lVar7 >> 5 == (long)t,&local_90,(TiXmlBase *)pTVar5);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&local_1d8,
               (long)local_240.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_240.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    pdVar2 = local_1d8._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)local_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = local_240.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = 0; lVar8 >> 5 != lVar7; lVar7 = lVar7 + 1) {
      pp_Var1 = (_func_int **)atof((pbVar9->_M_dataplus)._M_p);
      (&(((NamedVar *)pdVar2)->super_Variable)._vptr_Variable)[lVar7] = pp_Var1;
      pbVar9 = pbVar9 + 1;
    }
    bVar3 = Function::SetValue(__return_storage_ptr__,&local_160,
                               (vector<double,_std::allocator<double>_> *)&local_1d8);
    this_01 = local_208;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"In <RewardFunction>: Value assignment failed.",
               (allocator<char> *)&local_1f8);
    pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&local_250->super_TiXmlNode,"Instance");
    Ensure(this_01,bVar3,&local_70,(TiXmlBase *)pTVar5);
    std::__cxx11::string::~string((string *)&local_70);
    local_250 = util::tinyxml::TiXmlNode::NextSiblingElement(&local_250->super_TiXmlNode);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_240);
    std::__cxx11::string::~string((string *)&local_228);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_1b8);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

Function Parser::CreateRewardFunction(TiXmlElement* e_Func) {
	// <Var>
	string name = GetFirstChildText(e_Func, "Var");

	Ensure(Variable::IsVariableName(name, reward_vars_),
		"In <RewardFunction>: Variable " + name
			+ " has not been declared as a RewardVar vname within <Variable> tag.",
		e_Func->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(GetFirstChildText(e_Func, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string str = parent_names[i];
		parents.push_back(static_cast<StateVar*>(variables_[str]));
	}

	Function func(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_Func);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));
		instance.push_back(REWARD_VAR_VALUE);

		// <ValueTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ValueTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		vector<string> value_tokens = Tokenize(table);

		Ensure(num_entries == value_tokens.size(),
			"In <RewardFunction>: " + to_string(num_entries)
				+ " entries expected but " + to_string(value_tokens.size())
				+ " found.", GetFirstChildElement(e_Entry, "ValueTable"));

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		bool success = func.SetValue(instance, values);

		Ensure(success, "In <RewardFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}